

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O2

string * getTime_abi_cxx11_(void)

{
  tm *__tp;
  string *in_RDI;
  allocator local_71;
  time_t rawtime;
  char buffer [80];
  
  time(&rawtime);
  __tp = localtime(&rawtime);
  strftime(buffer,0x50,"%d-%m-%Y %I:%M:%S",__tp);
  std::__cxx11::string::string((string *)in_RDI,buffer,&local_71);
  return in_RDI;
}

Assistant:

String getTime(){
    time_t rawtime;
    struct tm * timeinfo;
    char buffer[80];

    time (&rawtime);
    timeinfo = localtime(&rawtime);

    strftime(buffer,sizeof(buffer),"%d-%m-%Y %I:%M:%S",timeinfo);
    return String(buffer);
}